

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

string * __thiscall
google::protobuf::(anonymous_namespace)::ToJsonName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,string_view input)

{
  string *psVar1;
  _anonymous_namespace_ *p_Var2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  psVar1 = (string *)std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (this != (_anonymous_namespace_ *)0x0) {
    p_Var2 = (_anonymous_namespace_ *)0x0;
    do {
      psVar1 = (string *)(ulong)(byte)p_Var2[input._M_len];
      if (psVar1 != (string *)0x5f) {
        psVar1 = (string *)std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      p_Var2 = p_Var2 + 1;
    } while (this != p_Var2);
  }
  return psVar1;
}

Assistant:

std::string ToJsonName(const absl::string_view input) {
  bool capitalize_next = false;
  std::string result;
  result.reserve(input.size());

  for (char character : input) {
    if (character == '_') {
      capitalize_next = true;
    } else if (capitalize_next) {
      result.push_back(absl::ascii_toupper(character));
      capitalize_next = false;
    } else {
      result.push_back(character);
    }
  }

  return result;
}